

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O2

bool __thiscall
TCMallocImplementation::GetNumericProperty(TCMallocImplementation *this,char *name,size_t *value)

{
  int iVar1;
  TestingPortal **ppTVar2;
  TestingPortal *pTVar3;
  ulong uVar4;
  ulong *puVar5;
  size_t *psVar6;
  undefined1 local_90 [8];
  TCMallocStats stats;
  
  iVar1 = strcmp(name,"generic.current_allocated_bytes");
  if (iVar1 == 0) {
    stats.pageheap._56_16_ = ZEXT816(0);
    stats.pageheap._40_16_ = ZEXT816(0);
    stats.pageheap._24_16_ = ZEXT816(0);
    stats.pageheap._8_16_ = ZEXT816(0);
    stats._24_16_ = ZEXT816(0);
    stats.pageheap.reserve_count = 0;
    ExtractStats((TCMallocStats *)local_90,(uint64_t *)0x0,(SmallSpanStats *)0x0,
                 (LargeSpanStats *)0x0);
    *value = stats.metadata_bytes -
             ((long)&(((atomic<int> *)local_90)->super___atomic_base<int>)._M_i +
             stats.pageheap.free_bytes + stats.central_bytes +
             stats.pageheap.system_bytes + stats.thread_bytes);
    return true;
  }
  iVar1 = strcmp(name,"generic.heap_size");
  if (iVar1 == 0) {
    stats.pageheap.decommit_count = 0;
    stats.pageheap.total_decommit_bytes = 0;
    stats.pageheap.commit_count = 0;
    stats.pageheap.total_commit_bytes = 0;
    stats.pageheap.committed_bytes = 0;
    stats.pageheap.scavenge_count = 0;
    stats.pageheap.free_bytes = 0;
    stats.pageheap.unmapped_bytes = 0;
    stats.metadata_bytes = 0;
    stats.pageheap.system_bytes = 0;
    stats.pageheap.reserve_count = 0;
    ExtractStats((TCMallocStats *)local_90,(uint64_t *)0x0,(SmallSpanStats *)0x0,
                 (LargeSpanStats *)0x0);
    local_90 = (undefined1  [8])stats.metadata_bytes;
    goto LAB_001127b1;
  }
  iVar1 = strcmp(name,"generic.total_physical_bytes");
  if (iVar1 == 0) {
    stats.pageheap.decommit_count = 0;
    stats.pageheap.total_decommit_bytes = 0;
    stats.pageheap.commit_count = 0;
    stats.pageheap.total_commit_bytes = 0;
    stats.pageheap.committed_bytes = 0;
    stats.pageheap.scavenge_count = 0;
    stats.pageheap.free_bytes = 0;
    stats.pageheap.unmapped_bytes = 0;
    stats.metadata_bytes = 0;
    stats.pageheap.system_bytes = 0;
    stats.pageheap.reserve_count = 0;
    ExtractStats((TCMallocStats *)local_90,(uint64_t *)0x0,(SmallSpanStats *)0x0,
                 (LargeSpanStats *)0x0);
    local_90 = (undefined1  [8])
               ((stats.transfer_bytes + stats.metadata_bytes) - stats.pageheap.free_bytes);
    goto LAB_001127b1;
  }
  iVar1 = strcmp(name,"tcmalloc.slack_bytes");
  if (iVar1 == 0) {
    local_90 = (undefined1  [8])(tcmalloc::Static::pageheap_ + 8);
    SpinLock::Lock((SpinLock *)(tcmalloc::Static::pageheap_ + 8));
    uVar4 = tcmalloc::Static::pageheap_._1585288_8_ + tcmalloc::Static::pageheap_._1585280_8_;
    goto LAB_001126db;
  }
  iVar1 = strcmp(name,"tcmalloc.central_cache_free_bytes");
  if (iVar1 == 0) {
    stats.pageheap.decommit_count = 0;
    stats.pageheap.total_decommit_bytes = 0;
    stats.pageheap.commit_count = 0;
    stats.pageheap.total_commit_bytes = 0;
    stats.pageheap.committed_bytes = 0;
    stats.pageheap.scavenge_count = 0;
    stats.pageheap.free_bytes = 0;
    stats.pageheap.unmapped_bytes = 0;
    stats.metadata_bytes = 0;
    stats.pageheap.system_bytes = 0;
    stats.pageheap.reserve_count = 0;
    ExtractStats((TCMallocStats *)local_90,(uint64_t *)0x0,(SmallSpanStats *)0x0,
                 (LargeSpanStats *)0x0);
    local_90 = (undefined1  [8])stats.thread_bytes;
    goto LAB_001127b1;
  }
  iVar1 = strcmp(name,"tcmalloc.transfer_cache_free_bytes");
  if (iVar1 == 0) {
    stats.pageheap.decommit_count = 0;
    stats.pageheap.total_decommit_bytes = 0;
    stats.pageheap.commit_count = 0;
    stats.pageheap.total_commit_bytes = 0;
    stats.pageheap.committed_bytes = 0;
    stats.pageheap.scavenge_count = 0;
    stats.pageheap.free_bytes = 0;
    stats.pageheap.unmapped_bytes = 0;
    stats.metadata_bytes = 0;
    stats.pageheap.system_bytes = 0;
    stats.pageheap.reserve_count = 0;
    ExtractStats((TCMallocStats *)local_90,(uint64_t *)0x0,(SmallSpanStats *)0x0,
                 (LargeSpanStats *)0x0);
    local_90 = (undefined1  [8])stats.central_bytes;
    goto LAB_001127b1;
  }
  iVar1 = strcmp(name,"tcmalloc.thread_cache_free_bytes");
  if (iVar1 == 0) {
LAB_00112772:
    stats.pageheap.decommit_count = 0;
    stats.pageheap.total_decommit_bytes = 0;
    stats.pageheap.commit_count = 0;
    stats.pageheap.total_commit_bytes = 0;
    stats.pageheap.committed_bytes = 0;
    stats.pageheap.scavenge_count = 0;
    stats.pageheap.free_bytes = 0;
    stats.pageheap.unmapped_bytes = 0;
    stats.metadata_bytes = 0;
    stats.pageheap.system_bytes = 0;
    stats.pageheap.reserve_count = 0;
    ExtractStats((TCMallocStats *)local_90,(uint64_t *)0x0,(SmallSpanStats *)0x0,
                 (LargeSpanStats *)0x0);
    goto LAB_001127b1;
  }
  iVar1 = strcmp(name,"tcmalloc.pageheap_free_bytes");
  if (iVar1 == 0) {
    local_90 = (undefined1  [8])(tcmalloc::Static::pageheap_ + 8);
    SpinLock::Lock((SpinLock *)(tcmalloc::Static::pageheap_ + 8));
    uVar4 = tcmalloc::Static::pageheap_._1585280_8_;
    goto LAB_001126db;
  }
  iVar1 = strcmp(name,"tcmalloc.pageheap_unmapped_bytes");
  if (iVar1 == 0) {
    local_90 = (undefined1  [8])(tcmalloc::Static::pageheap_ + 8);
    SpinLock::Lock((SpinLock *)(tcmalloc::Static::pageheap_ + 8));
    uVar4 = tcmalloc::Static::pageheap_._1585288_8_;
    goto LAB_001126db;
  }
  iVar1 = strcmp(name,"tcmalloc.pageheap_committed_bytes");
  if (iVar1 == 0) {
    local_90 = (undefined1  [8])(tcmalloc::Static::pageheap_ + 8);
    SpinLock::Lock((SpinLock *)(tcmalloc::Static::pageheap_ + 8));
    uVar4 = tcmalloc::Static::pageheap_._1585296_8_;
    goto LAB_001126db;
  }
  iVar1 = strcmp(name,"tcmalloc.pageheap_scavenge_count");
  if (iVar1 == 0) {
    local_90 = (undefined1  [8])(tcmalloc::Static::pageheap_ + 8);
    SpinLock::Lock((SpinLock *)(tcmalloc::Static::pageheap_ + 8));
    uVar4 = tcmalloc::Static::pageheap_._1585304_8_;
    goto LAB_001126db;
  }
  iVar1 = strcmp(name,"tcmalloc.pageheap_commit_count");
  if (iVar1 == 0) {
    local_90 = (undefined1  [8])(tcmalloc::Static::pageheap_ + 8);
    SpinLock::Lock((SpinLock *)(tcmalloc::Static::pageheap_ + 8));
    uVar4 = tcmalloc::Static::pageheap_._1585312_8_;
    goto LAB_001126db;
  }
  iVar1 = strcmp(name,"tcmalloc.pageheap_total_commit_bytes");
  if (iVar1 == 0) {
    local_90 = (undefined1  [8])(tcmalloc::Static::pageheap_ + 8);
    SpinLock::Lock((SpinLock *)(tcmalloc::Static::pageheap_ + 8));
    uVar4 = tcmalloc::Static::pageheap_._1585320_8_;
    goto LAB_001126db;
  }
  iVar1 = strcmp(name,"tcmalloc.pageheap_decommit_count");
  if (iVar1 == 0) {
    local_90 = (undefined1  [8])(tcmalloc::Static::pageheap_ + 8);
    SpinLock::Lock((SpinLock *)(tcmalloc::Static::pageheap_ + 8));
    uVar4 = tcmalloc::Static::pageheap_._1585328_8_;
    goto LAB_001126db;
  }
  iVar1 = strcmp(name,"tcmalloc.pageheap_total_decommit_bytes");
  if (iVar1 == 0) {
    local_90 = (undefined1  [8])(tcmalloc::Static::pageheap_ + 8);
    SpinLock::Lock((SpinLock *)(tcmalloc::Static::pageheap_ + 8));
    uVar4 = tcmalloc::Static::pageheap_._1585336_8_;
    goto LAB_001126db;
  }
  iVar1 = strcmp(name,"tcmalloc.pageheap_reserve_count");
  if (iVar1 == 0) {
    local_90 = (undefined1  [8])(tcmalloc::Static::pageheap_ + 8);
    SpinLock::Lock((SpinLock *)(tcmalloc::Static::pageheap_ + 8));
    uVar4 = tcmalloc::Static::pageheap_._1585344_8_;
    goto LAB_001126db;
  }
  iVar1 = strcmp(name,"tcmalloc.pageheap_total_reserve_bytes");
  if (iVar1 == 0) {
    local_90 = (undefined1  [8])(tcmalloc::Static::pageheap_ + 8);
    SpinLock::Lock((SpinLock *)(tcmalloc::Static::pageheap_ + 8));
    uVar4 = tcmalloc::Static::pageheap_._1585352_8_;
    goto LAB_001126db;
  }
  iVar1 = strcmp(name,"tcmalloc.max_total_thread_cache_bytes");
  if (iVar1 != 0) {
    iVar1 = strcmp(name,"tcmalloc.min_per_thread_cache_bytes");
    if (iVar1 == 0) {
      psVar6 = &tcmalloc::ThreadCache::min_per_thread_cache_size_;
    }
    else {
      iVar1 = strcmp(name,"tcmalloc.current_total_thread_cache_bytes");
      if (iVar1 == 0) goto LAB_00112772;
      iVar1 = strcmp(name,"tcmalloc.aggressive_memory_decommit");
      if (iVar1 == 0) {
        local_90 = (undefined1  [8])(tcmalloc::Static::pageheap_ + 8);
        SpinLock::Lock((SpinLock *)(tcmalloc::Static::pageheap_ + 8));
        uVar4 = (ulong)tcmalloc::Static::pageheap_[0x1830dc];
        goto LAB_001126db;
      }
      iVar1 = strcmp(name,"tcmalloc.heap_limit_mb");
      if (iVar1 == 0) {
        local_90 = (undefined1  [8])(tcmalloc::Static::pageheap_ + 8);
        SpinLock::Lock((SpinLock *)(tcmalloc::Static::pageheap_ + 8));
        puVar5 = &FLAG__namespace_do_not_use_directly_use_DECLARE_int64_t_instead::
                  FLAGS_tcmalloc_heap_limit_mb;
        goto LAB_00112933;
      }
      iVar1 = strcmp(name,"tcmalloc.impl.thread_cache_count");
      if (iVar1 == 0) {
        local_90 = (undefined1  [8])(tcmalloc::Static::pageheap_ + 8);
        SpinLock::Lock((SpinLock *)(tcmalloc::Static::pageheap_ + 8));
        uVar4 = (long)tcmalloc::ThreadCache::thread_heap_count_;
        goto LAB_001126db;
      }
      iVar1 = strcmp(name,"tcmalloc.sample_parameter");
      if (iVar1 != 0) {
        ppTVar2 = tcmalloc::TestingPortal::CheckGetPortal(name,value);
        if (ppTVar2 != (TestingPortal **)0x0) {
          pTVar3 = &tcmalloc::TestingPortalImpl::Get()->super_TestingPortal;
          *ppTVar2 = pTVar3;
          *value = 1;
          return true;
        }
        return false;
      }
      psVar6 = &FLAG__namespace_do_not_use_directly_use_DECLARE_int64_t_instead::
                FLAGS_tcmalloc_sample_parameter;
    }
    local_90 = (undefined1  [8])*psVar6;
LAB_001127b1:
    *value = (size_t)local_90;
    return true;
  }
  local_90 = (undefined1  [8])(tcmalloc::Static::pageheap_ + 8);
  SpinLock::Lock((SpinLock *)(tcmalloc::Static::pageheap_ + 8));
  puVar5 = &tcmalloc::ThreadCache::overall_thread_cache_size_;
LAB_00112933:
  uVar4 = *puVar5;
LAB_001126db:
  *value = uVar4;
  SpinLockHolder::~SpinLockHolder((SpinLockHolder *)local_90);
  return true;
}

Assistant:

virtual bool GetNumericProperty(const char* name, size_t* value) {
    ASSERT(name != nullptr);

    if (strcmp(name, "generic.current_allocated_bytes") == 0) {
      TCMallocStats stats;
      ExtractStats(&stats, nullptr, nullptr, nullptr);
      *value = stats.pageheap.system_bytes
               - stats.thread_bytes
               - stats.central_bytes
               - stats.transfer_bytes
               - stats.pageheap.free_bytes
               - stats.pageheap.unmapped_bytes;
      return true;
    }

    if (strcmp(name, "generic.heap_size") == 0) {
      TCMallocStats stats;
      ExtractStats(&stats, nullptr, nullptr, nullptr);
      *value = stats.pageheap.system_bytes;
      return true;
    }

    if (strcmp(name, "generic.total_physical_bytes") == 0) {
      TCMallocStats stats;
      ExtractStats(&stats, nullptr, nullptr, nullptr);
      *value = stats.pageheap.system_bytes + stats.metadata_bytes -
               stats.pageheap.unmapped_bytes;
      return true;
    }

    if (strcmp(name, "tcmalloc.slack_bytes") == 0) {
      // Kept for backwards compatibility.  Now defined externally as:
      //    pageheap_free_bytes + pageheap_unmapped_bytes.
      SpinLockHolder l(Static::pageheap_lock());
      PageHeap::Stats stats = Static::pageheap()->StatsLocked();
      *value = stats.free_bytes + stats.unmapped_bytes;
      return true;
    }

    if (strcmp(name, "tcmalloc.central_cache_free_bytes") == 0) {
      TCMallocStats stats;
      ExtractStats(&stats, nullptr, nullptr, nullptr);
      *value = stats.central_bytes;
      return true;
    }

    if (strcmp(name, "tcmalloc.transfer_cache_free_bytes") == 0) {
      TCMallocStats stats;
      ExtractStats(&stats, nullptr, nullptr, nullptr);
      *value = stats.transfer_bytes;
      return true;
    }

    if (strcmp(name, "tcmalloc.thread_cache_free_bytes") == 0) {
      TCMallocStats stats;
      ExtractStats(&stats, nullptr, nullptr, nullptr);
      *value = stats.thread_bytes;
      return true;
    }

    if (strcmp(name, "tcmalloc.pageheap_free_bytes") == 0) {
      SpinLockHolder l(Static::pageheap_lock());
      *value = Static::pageheap()->StatsLocked().free_bytes;
      return true;
    }

    if (strcmp(name, "tcmalloc.pageheap_unmapped_bytes") == 0) {
      SpinLockHolder l(Static::pageheap_lock());
      *value = Static::pageheap()->StatsLocked().unmapped_bytes;
      return true;
    }

    if (strcmp(name, "tcmalloc.pageheap_committed_bytes") == 0) {
      SpinLockHolder l(Static::pageheap_lock());
      *value = Static::pageheap()->StatsLocked().committed_bytes;
      return true;
    }

    if (strcmp(name, "tcmalloc.pageheap_scavenge_count") == 0) {
      SpinLockHolder l(Static::pageheap_lock());
      *value = Static::pageheap()->StatsLocked().scavenge_count;
      return true;
    }

    if (strcmp(name, "tcmalloc.pageheap_commit_count") == 0) {
      SpinLockHolder l(Static::pageheap_lock());
      *value = Static::pageheap()->StatsLocked().commit_count;
      return true;
    }

    if (strcmp(name, "tcmalloc.pageheap_total_commit_bytes") == 0) {
      SpinLockHolder l(Static::pageheap_lock());
      *value = Static::pageheap()->StatsLocked().total_commit_bytes;
      return true;
    }

    if (strcmp(name, "tcmalloc.pageheap_decommit_count") == 0) {
      SpinLockHolder l(Static::pageheap_lock());
      *value = Static::pageheap()->StatsLocked().decommit_count;
      return true;
    }

    if (strcmp(name, "tcmalloc.pageheap_total_decommit_bytes") == 0) {
      SpinLockHolder l(Static::pageheap_lock());
      *value = Static::pageheap()->StatsLocked().total_decommit_bytes;
      return true;
    }

    if (strcmp(name, "tcmalloc.pageheap_reserve_count") == 0) {
      SpinLockHolder l(Static::pageheap_lock());
      *value = Static::pageheap()->StatsLocked().reserve_count;
      return true;
    }

    if (strcmp(name, "tcmalloc.pageheap_total_reserve_bytes") == 0) {
      SpinLockHolder l(Static::pageheap_lock());
      *value = Static::pageheap()->StatsLocked().total_reserve_bytes;
      return true;
    }

    if (strcmp(name, "tcmalloc.max_total_thread_cache_bytes") == 0) {
      SpinLockHolder l(Static::pageheap_lock());
      *value = ThreadCache::overall_thread_cache_size();
      return true;
    }

    if (strcmp(name, "tcmalloc.min_per_thread_cache_bytes") == 0) {
      *value = ThreadCache::min_per_thread_cache_size();
      return true;
    }

    if (strcmp(name, "tcmalloc.current_total_thread_cache_bytes") == 0) {
      TCMallocStats stats;
      ExtractStats(&stats, nullptr, nullptr, nullptr);
      *value = stats.thread_bytes;
      return true;
    }

    if (strcmp(name, "tcmalloc.aggressive_memory_decommit") == 0) {
      SpinLockHolder l(Static::pageheap_lock());
      *value = size_t(Static::pageheap()->GetAggressiveDecommit());
      return true;
    }

    if (strcmp(name, "tcmalloc.heap_limit_mb") == 0) {
      SpinLockHolder l(Static::pageheap_lock());
      *value = FLAGS_tcmalloc_heap_limit_mb;
      return true;
    }

    if (strcmp(name, "tcmalloc.impl.thread_cache_count") == 0) {
      SpinLockHolder h(Static::pageheap_lock());
      *value = ThreadCache::thread_heap_count();
      return true;
    }

    if (strcmp(name, "tcmalloc.sample_parameter") == 0) {
      *value = FLAGS_tcmalloc_sample_parameter;
      return true;
    }

    if (TestingPortal** portal = TestingPortal::CheckGetPortal(name, value); portal) {
      *portal = TestingPortalImpl::Get();
      *value = 1;
      return true;
    }

    return false;
  }